

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrintValidatorTests.cpp
# Opt level: O0

int testVisionFeatureScenePrintBasic(void)

{
  Model *this;
  bool bVar1;
  ImageFeatureType *this_00;
  FeatureType *this_01;
  ArrayFeatureType *this_02;
  FeatureType *this_03;
  ModelDescription *this_04;
  FeatureDescription *this_05;
  FeatureDescription *this_06;
  VisionFeaturePrint_Scene *this_07;
  ostream *poVar2;
  Result local_138;
  Result local_110;
  Result local_e8;
  VisionFeaturePrint *local_c0;
  VisionFeaturePrint *preprocessing;
  undefined1 local_b0 [8];
  Result result;
  Model model;
  FeatureDescription *output;
  FeatureDescription *input;
  ModelDescription *description;
  FeatureType *outputFeatureType;
  ArrayFeatureType *outputArrayFeatureType;
  FeatureType *inputFeatureType;
  ImageFeatureType *inputImageFeatureType;
  
  this_00 = (ImageFeatureType *)operator_new(0x38);
  CoreML::Specification::ImageFeatureType::ImageFeatureType(this_00);
  this_01 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(this_01);
  CoreML::Specification::FeatureType::set_allocated_imagetype(this_01,this_00);
  this_02 = (ArrayFeatureType *)operator_new(0x48);
  CoreML::Specification::ArrayFeatureType::ArrayFeatureType(this_02);
  this_03 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(this_03);
  CoreML::Specification::FeatureType::set_allocated_multiarraytype(this_03,this_02);
  this_04 = (ModelDescription *)operator_new(0x78);
  CoreML::Specification::ModelDescription::ModelDescription(this_04);
  this_05 = CoreML::Specification::ModelDescription::add_input(this_04);
  this_06 = CoreML::Specification::ModelDescription::add_output(this_04);
  CoreML::Specification::FeatureDescription::set_allocated_type(this_05,this_01);
  CoreML::Specification::FeatureDescription::set_allocated_type(this_06,this_03);
  this = (Model *)((long)&result.m_message.field_2 + 8);
  CoreML::Specification::Model::Model(this);
  CoreML::Specification::Model::set_allocated_description(this,this_04);
  CoreML::validate<(MLModelType)2002>
            ((Result *)local_b0,(Model *)((long)&result.m_message.field_2 + 8));
  bVar1 = CoreML::Result::good((Result *)local_b0);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/VisionFeaturePrintValidatorTests.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x29);
    poVar2 = std::operator<<(poVar2,": error: ");
    poVar2 = std::operator<<(poVar2,"!((result).good())");
    poVar2 = std::operator<<(poVar2," was false, expected true.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    inputImageFeatureType._4_4_ = 1;
  }
  else {
    local_c0 = CoreML::Specification::Model::mutable_visionfeatureprint
                         ((Model *)((long)&result.m_message.field_2 + 8));
    CoreML::validate<(MLModelType)2002>(&local_e8,(Model *)((long)&result.m_message.field_2 + 8));
    CoreML::Result::operator=((Result *)local_b0,&local_e8);
    CoreML::Result::~Result(&local_e8);
    bVar1 = CoreML::Result::good((Result *)local_b0);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/VisionFeaturePrintValidatorTests.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x2d);
      poVar2 = std::operator<<(poVar2,": error: ");
      poVar2 = std::operator<<(poVar2,"!((result).good())");
      poVar2 = std::operator<<(poVar2," was false, expected true.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      inputImageFeatureType._4_4_ = 1;
    }
    else {
      CoreML::Specification::CoreMLModels::VisionFeaturePrint::mutable_scene(local_c0);
      CoreML::validate<(MLModelType)2002>(&local_110,(Model *)((long)&result.m_message.field_2 + 8))
      ;
      CoreML::Result::operator=((Result *)local_b0,&local_110);
      CoreML::Result::~Result(&local_110);
      bVar1 = CoreML::Result::good((Result *)local_b0);
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/VisionFeaturePrintValidatorTests.cpp"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x31);
        poVar2 = std::operator<<(poVar2,": error: ");
        poVar2 = std::operator<<(poVar2,"!((result).good())");
        poVar2 = std::operator<<(poVar2," was false, expected true.");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        inputImageFeatureType._4_4_ = 1;
      }
      else {
        this_07 = CoreML::Specification::CoreMLModels::VisionFeaturePrint::mutable_scene(local_c0);
        CoreML::Specification::CoreMLModels::VisionFeaturePrint_Scene::set_version
                  (this_07,VisionFeaturePrint_Scene_SceneVersion_SCENE_VERSION_1);
        CoreML::validate<(MLModelType)2002>
                  (&local_138,(Model *)((long)&result.m_message.field_2 + 8));
        CoreML::Result::operator=((Result *)local_b0,&local_138);
        CoreML::Result::~Result(&local_138);
        bVar1 = CoreML::Result::good((Result *)local_b0);
        if (bVar1) {
          inputImageFeatureType._4_4_ = 0;
        }
        else {
          poVar2 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/VisionFeaturePrintValidatorTests.cpp"
                                  );
          poVar2 = std::operator<<(poVar2,":");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x35);
          poVar2 = std::operator<<(poVar2,": error: ");
          poVar2 = std::operator<<(poVar2,"(result).good()");
          poVar2 = std::operator<<(poVar2," was false, expected true.");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          inputImageFeatureType._4_4_ = 1;
        }
      }
    }
  }
  preprocessing._4_4_ = 1;
  CoreML::Result::~Result((Result *)local_b0);
  CoreML::Specification::Model::~Model((Model *)((long)&result.m_message.field_2 + 8));
  return inputImageFeatureType._4_4_;
}

Assistant:

int testVisionFeatureScenePrintBasic() {

    Specification::ImageFeatureType* inputImageFeatureType = new Specification::ImageFeatureType();
    Specification::FeatureType* inputFeatureType = new Specification::FeatureType();
    inputFeatureType->set_allocated_imagetype(inputImageFeatureType);

    Specification::ArrayFeatureType* outputArrayFeatureType = new Specification::ArrayFeatureType();
    Specification::FeatureType* outputFeatureType = new Specification::FeatureType();
    outputFeatureType->set_allocated_multiarraytype(outputArrayFeatureType);

    Specification::ModelDescription* description = new Specification::ModelDescription();
    Specification::FeatureDescription* input = description->add_input();
    Specification::FeatureDescription* output = description->add_output();
    input->set_allocated_type(inputFeatureType);
    output->set_allocated_type(outputFeatureType);

    Specification::Model model;
    model.set_allocated_description(description);

    Result result = validate<MLModelType_visionFeaturePrint>(model);
    ML_ASSERT_BAD(result);

    auto *preprocessing = model.mutable_visionfeatureprint();
    result = validate<MLModelType_visionFeaturePrint>(model);
    ML_ASSERT_BAD(result);

    preprocessing->mutable_scene();
    result = validate<MLModelType_visionFeaturePrint>(model);
    ML_ASSERT_BAD(result);

    preprocessing->mutable_scene()->set_version(Specification::CoreMLModels::VisionFeaturePrint_Scene_SceneVersion_SCENE_VERSION_1);
    result = validate<MLModelType_visionFeaturePrint>(model);
    ML_ASSERT_GOOD(result);
    
    return 0;
}